

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int findCompatibleInRhsSubrtn(Parse *pParse,Expr *pExpr,SubrtnSig *pNewSig)

{
  SubrtnSig *pSVar1;
  int iVar2;
  VdbeOp *pVVar3;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  Vdbe *v;
  SubrtnSig *pSig;
  VdbeOp *pEnd;
  VdbeOp *pOp;
  VdbeOp *local_28;
  
  if ((in_RDX != (int *)0x0) && (((uint)*(byte *)(in_RDI + 0x28) & 1 << ((byte)*in_RDX & 7)) != 0))
  {
    local_28 = sqlite3VdbeGetOp(*(Vdbe **)(in_RDI + 0x10),1);
    pVVar3 = sqlite3VdbeGetLastOp((Vdbe *)0x1d3aa0);
    for (; local_28 < pVVar3; local_28 = local_28 + 1) {
      if ((((local_28->p4type == -0x11) &&
           (pSVar1 = (local_28->p4).pSubrtnSig, pSVar1->bComplete != '\0')) &&
          (*in_RDX == pSVar1->selId)) &&
         (iVar2 = strcmp(*(char **)(in_RDX + 2),pSVar1->zAff), iVar2 == 0)) {
        *(int *)(in_RSI + 0x40) = pSVar1->iAddr;
        *(int *)(in_RSI + 0x44) = pSVar1->regReturn;
        *(int *)(in_RSI + 0x2c) = pSVar1->iTable;
        *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x2000000;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int findCompatibleInRhsSubrtn(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* IN operator with RHS that we want to reuse */
  SubrtnSig *pNewSig      /* Signature for the IN operator */
){
  VdbeOp *pOp, *pEnd;
  SubrtnSig *pSig;
  Vdbe *v;

  if( pNewSig==0 ) return 0;
  if( (pParse->mSubrtnSig & (1<<(pNewSig->selId&7)))==0 ) return 0;
  assert( pExpr->op==TK_IN );
  assert( !ExprUseYSub(pExpr) );
  assert( ExprUseXSelect(pExpr) );
  assert( pExpr->x.pSelect!=0 );
  assert( (pExpr->x.pSelect->selFlags & SF_All)==0 );
  v = pParse->pVdbe;
  assert( v!=0 );
  pOp = sqlite3VdbeGetOp(v, 1);
  pEnd = sqlite3VdbeGetLastOp(v);
  for(; pOp<pEnd; pOp++){
    if( pOp->p4type!=P4_SUBRTNSIG ) continue;
    assert( pOp->opcode==OP_BeginSubrtn );
    pSig = pOp->p4.pSubrtnSig;
    assert( pSig!=0 );
    if( !pSig->bComplete ) continue;
    if( pNewSig->selId!=pSig->selId ) continue;
    if( strcmp(pNewSig->zAff,pSig->zAff)!=0 ) continue;
    pExpr->y.sub.iAddr = pSig->iAddr;
    pExpr->y.sub.regReturn = pSig->regReturn;
    pExpr->iTable = pSig->iTable;
    ExprSetProperty(pExpr, EP_Subrtn);
    return 1;
  }
  return 0;
}